

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

void soplex::
     SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start,bool type)

{
  type_conflict5 tVar1;
  uint uVar2;
  ulong uVar3;
  undefined4 in_register_0000000c;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  IdxElement *pIVar9;
  undefined7 in_register_00000081;
  uint uVar10;
  IdxElement *pIVar11;
  int start_00;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  int local_3f4;
  IdxElement *local_3f0;
  uint local_3e4;
  IdxCompare *local_3e0;
  long local_3d8;
  long local_3d0;
  ulong local_3c8;
  IdxElement *local_3c0;
  ulong local_3b8;
  IdxElement pivotkey;
  IdxElement tmp;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_338;
  IdxElement local_300;
  IdxElement local_2c4;
  IdxElement local_288;
  IdxElement local_24c;
  IdxElement local_210;
  IdxElement local_1d4;
  IdxElement local_198;
  IdxElement local_15c;
  IdxElement local_120;
  IdxElement local_e4;
  IdxElement local_a8;
  IdxElement local_6c;
  
  uVar13 = CONCAT44(in_register_0000000c,start);
  local_3e4 = (uint)CONCAT71(in_register_00000081,type);
  if (end <= start + 1) {
    return;
  }
  uVar6 = (ulong)(end - 1);
  local_3f0 = keys;
  local_3e0 = compare;
LAB_0026403e:
  iVar7 = (int)uVar6;
  start_00 = (int)uVar13;
  uVar2 = iVar7 - start_00;
  if ((int)uVar2 < 0x19) {
    if ((int)uVar2 < 1) {
      return;
    }
    SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (keys,iVar7,local_3e0,start_00);
    return;
  }
  pivotkey.val.m_backend.fpclass = cpp_dec_float_finite;
  pivotkey.val.m_backend.data._M_elems._32_5_ = 0;
  pivotkey.val.m_backend._37_8_ = 0;
  pivotkey.val.m_backend.data._M_elems[4] = 0;
  pivotkey.val.m_backend.data._M_elems[5] = 0;
  pivotkey.val.m_backend.data._M_elems._24_5_ = 0;
  pivotkey.val.m_backend.data._M_elems[7]._1_3_ = 0;
  pivotkey.val.m_backend.data._M_elems[0] = 0;
  pivotkey.val.m_backend.data._M_elems[1] = 0;
  pivotkey.val.m_backend.data._M_elems[2] = 0;
  pivotkey.val.m_backend.data._M_elems[3] = 0;
  pivotkey.val.m_backend.prec_elem = 10;
  tmp.val.m_backend.fpclass = cpp_dec_float_finite;
  tmp.val.m_backend.data._M_elems._32_5_ = 0;
  tmp.val.m_backend._37_8_ = 0;
  tmp.val.m_backend.data._M_elems[4] = 0;
  tmp.val.m_backend.data._M_elems[5] = 0;
  tmp.val.m_backend.data._M_elems._24_5_ = 0;
  tmp.val.m_backend.data._M_elems[7]._1_3_ = 0;
  tmp.val.m_backend.data._M_elems[0] = 0;
  tmp.val.m_backend.data._M_elems[1] = 0;
  tmp.val.m_backend.data._M_elems[2] = 0;
  tmp.val.m_backend.data._M_elems[3] = 0;
  local_3c0 = keys + (int)((uVar2 >> 1) + start_00);
  tmp.val.m_backend.prec_elem = pivotkey.val.m_backend.prec_elem;
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::IdxElement::operator=(&pivotkey,local_3c0);
  local_3d0 = (long)iVar7;
  local_3d8 = (long)start_00;
  uVar3 = uVar13 & 0xffffffff;
  uVar8 = uVar6 & 0xffffffff;
  local_3c8 = uVar6;
  local_3b8 = uVar13;
  do {
    lVar5 = (long)(int)uVar3;
    if ((local_3e4 & 1) == 0) {
      uVar13 = (ulong)(int)uVar8;
      pIVar9 = local_3f0 + lVar5;
      for (; lVar5 < local_3d0; lVar5 = lVar5 + 1) {
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_15c,pIVar9);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_198,&pivotkey);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()(&local_338,local_3e0,&local_15c,&local_198);
        local_3f4 = 0;
        tVar1 = boost::multiprecision::operator<=(&local_338,&local_3f4);
        if (!tVar1) break;
        pIVar9 = pIVar9 + 1;
      }
      pIVar9 = local_3f0 + uVar13;
      for (; local_3d8 < (long)uVar13; uVar13 = uVar13 - 1) {
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_1d4,pIVar9);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_210,&pivotkey);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()(&local_338,local_3e0,&local_1d4,&local_210);
        local_3f4 = 0;
        tVar1 = boost::multiprecision::operator>(&local_338,&local_3f4);
        if (!tVar1) break;
        pIVar9 = pIVar9 + -1;
      }
    }
    else {
      pIVar9 = local_3f0 + lVar5;
      for (; lVar5 < local_3d0; lVar5 = lVar5 + 1) {
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_6c,pIVar9);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_a8,&pivotkey);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()(&local_338,local_3e0,&local_6c,&local_a8);
        local_3f4 = 0;
        tVar1 = boost::multiprecision::operator<(&local_338,&local_3f4);
        if (!tVar1) break;
        pIVar9 = pIVar9 + 1;
      }
      uVar13 = (ulong)(int)uVar8;
      pIVar9 = local_3f0 + uVar13;
      for (; local_3d8 < (long)uVar13; uVar13 = uVar13 - 1) {
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_e4,pIVar9);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_120,&pivotkey);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()(&local_338,local_3e0,&local_e4,&local_120);
        local_3f4 = 0;
        tVar1 = boost::multiprecision::operator>=(&local_338,&local_3f4);
        if (!tVar1) break;
        pIVar9 = pIVar9 + -1;
      }
    }
    pIVar9 = local_3f0;
    uVar2 = (uint)lVar5;
    iVar7 = (int)uVar13;
    if (iVar7 <= (int)uVar2) break;
    pIVar11 = local_3f0 + (int)uVar2;
    SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::IdxElement::operator=(&tmp,pIVar11);
    SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::IdxElement::operator=(pIVar11,pIVar9 + iVar7);
    SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::IdxElement::operator=(pIVar9 + iVar7,&tmp);
    uVar3 = (ulong)(uVar2 + 1);
    uVar8 = (ulong)(iVar7 - 1);
  } while( true );
  if ((local_3e4 & 1) == 0) {
    uVar13 = (ulong)iVar7;
    pIVar9 = local_3f0 + uVar13;
    for (; local_3d8 < (long)uVar13; uVar13 = uVar13 - 1) {
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(&local_2c4,&pivotkey);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(&local_300,pIVar9);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxCompare::operator()(&local_338,local_3e0,&local_2c4,&local_300);
      local_3f4 = 0;
      tVar1 = boost::multiprecision::operator<=(&local_338,&local_3f4);
      if (!tVar1) break;
      pIVar9 = pIVar9 + -1;
    }
    uVar6 = local_3c8;
    iVar7 = (int)local_3c8;
    if (iVar7 == (int)uVar13) {
      pIVar11 = local_3f0 + local_3d0;
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(&tmp,pIVar11);
      pIVar9 = local_3c0;
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(pIVar11,local_3c0);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(pIVar9,&tmp);
      uVar13 = (ulong)(iVar7 - 1);
    }
  }
  else {
    uVar6 = (ulong)(int)uVar2;
    pIVar9 = local_3f0 + uVar6;
    for (; (long)uVar6 < local_3d0; uVar6 = uVar6 + 1) {
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(&local_24c,&pivotkey);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(&local_288,pIVar9);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxCompare::operator()(&local_338,local_3e0,&local_24c,&local_288);
      local_3f4 = 0;
      tVar1 = boost::multiprecision::operator>=(&local_338,&local_3f4);
      if (!tVar1) break;
      pIVar9 = pIVar9 + 1;
    }
    iVar7 = (int)local_3b8;
    if (iVar7 == (int)uVar6) {
      pIVar11 = local_3f0 + local_3d8;
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(&tmp,pIVar11);
      pIVar9 = local_3c0;
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(pIVar11,local_3c0);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(pIVar9,&tmp);
      uVar6 = (ulong)(iVar7 + 1);
    }
    uVar2 = (uint)uVar6;
    uVar6 = local_3c8;
  }
  keys = local_3f0;
  uVar12 = (uint)uVar13;
  uVar4 = (uint)local_3b8;
  uVar10 = (uint)uVar6;
  if ((int)(uVar10 - uVar2) < (int)(uVar12 - uVar4)) {
    bVar15 = SBORROW4(uVar10,uVar2);
    iVar7 = uVar10 - uVar2;
    bVar14 = uVar10 == uVar2;
    uVar6 = uVar13 & 0xffffffff;
    uVar12 = uVar10;
    uVar10 = uVar2;
    uVar2 = uVar4;
  }
  else {
    bVar15 = SBORROW4(uVar12,uVar4);
    iVar7 = uVar12 - uVar4;
    bVar14 = uVar12 == uVar4;
    uVar10 = uVar4;
  }
  if (!bVar14 && bVar15 == iVar7 < 0) {
    SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (local_3f0,uVar12 + 1,local_3e0,uVar10,(bool)(~(byte)local_3e4 & 1));
  }
  local_3e4 = local_3e4 ^ 1;
  uVar13 = (ulong)uVar2;
  goto LAB_0026403e;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}